

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::PausableReadAsyncIoStream::tryPumpFrom
          (PausableReadAsyncIoStream *this,AsyncInputStream *input,uint64_t amount)

{
  PromiseArenaMember *node;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar1;
  Maybe<kj::Promise<unsigned_long>_> MVar2;
  Maybe<kj::Promise<unsigned_long>_> result;
  byte local_48 [8];
  PromiseArenaMember *local_40;
  undefined1 local_38 [32];
  
  (**(code **)(input[3]._vptr_AsyncInputStream[1] + 0x10))
            (local_48,input[3]._vptr_AsyncInputStream + 1);
  if (local_48[0] == 1) {
    trackWrite((Deferred<kj::Function<void_()>_> *)(local_38 + 8),(PausableReadAsyncIoStream *)input
              );
    Promise<unsigned_long>::attach<kj::_::Deferred<kj::Function<void()>>>
              ((Promise<unsigned_long> *)local_38,(Deferred<kj::Function<void_()>_> *)&local_40);
    *(undefined1 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = 1;
    (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)local_38._0_8_;
    local_38._0_8_ = (Disposer *)0x0;
    kj::_::Deferred<kj::Function<void_()>_>::~Deferred
              ((Deferred<kj::Function<void_()>_> *)(local_38 + 8));
    aVar1 = extraout_RDX_00;
  }
  else {
    *(undefined1 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = 0;
    aVar1 = extraout_RDX;
  }
  node = local_40;
  if (((local_48[0] & 1) != 0) && (local_40 != (PromiseArenaMember *)0x0)) {
    local_40 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
    aVar1 = extraout_RDX_01;
  }
  MVar2.ptr.field_1 = aVar1;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> PausableReadAsyncIoStream::tryPumpFrom(
    kj::AsyncInputStream& input, uint64_t amount) {
  auto result = inner->tryPumpFrom(input, amount);
  KJ_IF_SOME(r, result) {
    return r.attach(trackWrite());
  } else {
    return kj::none;
  }
}